

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picosha2.h
# Opt level: O0

void __thiscall
picosha2::hash256_one_by_one::process<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (hash256_one_by_one *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last)

{
  word_t n;
  ulong uVar1;
  size_type sVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a0;
  const_iterator local_98;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  const_iterator local_88;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  uchar *local_70;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  long local_58;
  size_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  char *local_30;
  char *local_28;
  hash256_one_by_one *local_20;
  hash256_one_by_one *this_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_local;
  
  local_30 = last._M_current;
  local_28 = first._M_current;
  local_20 = this;
  this_local = (hash256_one_by_one *)last._M_current;
  last_local = first;
  n = std::distance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(first,last);
  add_to_data_length(this,n);
  local_38._M_current = last_local._M_current;
  local_40._M_current = (char *)this_local;
  local_48 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       (&this->buffer_);
  i = (size_t)std::
              copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        (local_38,local_40,
                         (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )local_48);
  local_58 = 0;
  while( true ) {
    uVar1 = local_58 + 0x40;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer_);
    if (sVar2 < uVar1) break;
    local_68._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->buffer_);
    local_60 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_68,local_58);
    local_80._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->buffer_);
    local_78 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_80,local_58);
    local_70 = (uchar *)__gnu_cxx::
                        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+(&local_78,0x40);
    detail::
    hash256_block<unsigned_long*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (this->h_,local_60,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_70);
    local_58 = local_58 + 0x40;
  }
  local_90._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->buffer_);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_88,&local_90);
  local_a8._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->buffer_);
  local_a0 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_a8,local_58);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_98,&local_a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
            (&this->buffer_,local_88,local_98);
  return;
}

Assistant:

void process(RaIter first, RaIter last) {
        add_to_data_length(static_cast<word_t>(std::distance(first, last)));
        std::copy(first, last, std::back_inserter(buffer_));
        std::size_t i = 0;
        for (; i + 64 <= buffer_.size(); i += 64) {
            detail::hash256_block(h_, buffer_.begin() + i,
                                  buffer_.begin() + i + 64);
        }
        buffer_.erase(buffer_.begin(), buffer_.begin() + i);
    }